

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Stress::FenceSyncCase::deinit(FenceSyncCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  size_type sVar2;
  reference pp_Var3;
  __normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_> local_38;
  const_iterator local_30;
  __normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_> local_28;
  const_iterator local_20;
  int local_14;
  FenceSyncCase *pFStack_10;
  int i;
  FenceSyncCase *this_local;
  
  pFStack_10 = this;
  if (this->m_program != (ShaderProgram *)0x0) {
    this_00 = this->m_program;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
  }
  local_14 = 0;
  while( true ) {
    iVar1 = local_14;
    sVar2 = std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::size(&this->m_syncObjects);
    if ((int)sVar2 <= iVar1) break;
    pp_Var3 = std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::operator[]
                        (&this->m_syncObjects,(long)local_14);
    if (*pp_Var3 != (value_type)0x0) {
      pp_Var3 = std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::operator[]
                          (&this->m_syncObjects,(long)local_14);
      glwDeleteSync(*pp_Var3);
    }
    local_14 = local_14 + 1;
  }
  local_28._M_current =
       (__GLsync **)
       std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::begin(&this->m_syncObjects);
  __gnu_cxx::__normal_iterator<__GLsync*const*,std::vector<__GLsync*,std::allocator<__GLsync*>>>::
  __normal_iterator<__GLsync**>
            ((__normal_iterator<__GLsync*const*,std::vector<__GLsync*,std::allocator<__GLsync*>>> *)
             &local_20,&local_28);
  local_38._M_current =
       (__GLsync **)std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::end(&this->m_syncObjects);
  __gnu_cxx::__normal_iterator<__GLsync*const*,std::vector<__GLsync*,std::allocator<__GLsync*>>>::
  __normal_iterator<__GLsync**>
            ((__normal_iterator<__GLsync*const*,std::vector<__GLsync*,std::allocator<__GLsync*>>> *)
             &local_30,&local_38);
  std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::erase
            (&this->m_syncObjects,local_20,local_30);
  return;
}

Assistant:

void FenceSyncCase::deinit (void)
{
	if (m_program)
	{
		delete m_program;
		m_program = DE_NULL;
	}

	for (int i = 0; i < (int)m_syncObjects.size(); i++)
		if (m_syncObjects[i])
			glDeleteSync(m_syncObjects[i]);

	m_syncObjects.erase(m_syncObjects.begin(), m_syncObjects.end());
}